

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O0

void __thiscall Imf_3_3::TiledOutputFile::Data::~Data(Data *this)

{
  bool bVar1;
  pointer_conflict ppVar2;
  size_type sVar3;
  reference ppTVar4;
  long in_RDI;
  size_t i_1;
  iterator i;
  map<Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_3_3::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>_>
  *in_stack_ffffffffffffffa8;
  BufferedTile *in_stack_ffffffffffffffb0;
  TileBuffer *this_00;
  Header *in_stack_ffffffffffffffc0;
  ulong local_20;
  _Self local_18;
  _Self local_10 [2];
  
  if (*(void **)(in_RDI + 0xa8) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0xa8));
  }
  if (*(void **)(in_RDI + 0xb0) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0xb0));
  }
  local_10[0]._M_node =
       (_Base_ptr)
       std::
       map<Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_3_3::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>_>
       ::begin(in_stack_ffffffffffffffa8);
  while( true ) {
    local_18._M_node =
         (_Base_ptr)
         std::
         map<Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_3_3::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>_>
         ::end(in_stack_ffffffffffffffa8);
    bVar1 = std::operator!=(local_10,&local_18);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>
                           *)0x1b654b);
    in_stack_ffffffffffffffc0 = (Header *)ppVar2->second;
    if (in_stack_ffffffffffffffc0 != (Header *)0x0) {
      anon_unknown_5::BufferedTile::~BufferedTile(in_stack_ffffffffffffffb0);
      operator_delete(in_stack_ffffffffffffffc0,0x10);
    }
    std::
    _Rb_tree_iterator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>
                  *)in_stack_ffffffffffffffb0);
  }
  local_20 = 0;
  while( true ) {
    sVar3 = std::
            vector<Imf_3_3::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_3::(anonymous_namespace)::TileBuffer_*>_>
            ::size((vector<Imf_3_3::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_3::(anonymous_namespace)::TileBuffer_*>_>
                    *)(in_RDI + 0x108));
    if (sVar3 <= local_20) break;
    ppTVar4 = std::
              vector<Imf_3_3::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_3::(anonymous_namespace)::TileBuffer_*>_>
              ::operator[]((vector<Imf_3_3::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_3::(anonymous_namespace)::TileBuffer_*>_>
                            *)(in_RDI + 0x108),local_20);
    this_00 = *ppTVar4;
    if (this_00 != (TileBuffer *)0x0) {
      anon_unknown_5::TileBuffer::~TileBuffer(this_00);
      operator_delete(this_00,0x88);
    }
    local_20 = local_20 + 1;
  }
  std::
  map<Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_3_3::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>_>
  ::~map((map<Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_3_3::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_3::(anonymous_namespace)::TileCoord,_Imf_3_3::(anonymous_namespace)::BufferedTile_*>_>_>
          *)0x1b6612);
  std::
  vector<Imf_3_3::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_3::(anonymous_namespace)::TileBuffer_*>_>
  ::~vector((vector<Imf_3_3::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_3::(anonymous_namespace)::TileBuffer_*>_>
             *)in_stack_ffffffffffffffc0);
  std::
  vector<Imf_3_3::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_3::(anonymous_namespace)::TOutSliceInfo>_>
  ::~vector((vector<Imf_3_3::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_3::(anonymous_namespace)::TOutSliceInfo>_>
             *)in_stack_ffffffffffffffc0);
  TileOffsets::~TileOffsets((TileOffsets *)0x1b6645);
  FrameBuffer::~FrameBuffer((FrameBuffer *)0x1b6653);
  Header::~Header(in_stack_ffffffffffffffc0);
  return;
}

Assistant:

TiledOutputFile::Data::~Data ()
{
    delete[] numXTiles;
    delete[] numYTiles;

    //
    // Delete all the tile buffers, if any still happen to exist
    //

    for (TileMap::iterator i = tileMap.begin (); i != tileMap.end (); ++i)
        delete i->second;

    for (size_t i = 0; i < tileBuffers.size (); i++)
        delete tileBuffers[i];
}